

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluateTest.hpp
# Opt level: O0

void Qentem::Test::TestEvaluate18(QTest *test)

{
  unsigned_long_long local_458;
  QNumber64 local_450;
  int local_444;
  QNumber64 local_440;
  int local_434;
  QNumber64 local_430;
  unsigned_long_long local_428;
  QNumber64 local_420;
  unsigned_long_long local_418;
  QNumber64 local_410;
  unsigned_long_long local_408;
  QNumber64 local_400;
  int local_3f4;
  QNumber64 local_3f0;
  int local_3e4;
  QNumber64 local_3e0;
  unsigned_long_long local_3d8;
  QNumber64 local_3d0;
  unsigned_long_long local_3c8;
  QNumber64 local_3c0;
  int local_3b4;
  QNumber64 local_3b0;
  unsigned_long_long local_3a8;
  QNumber64 local_3a0;
  int local_394;
  QNumber64 local_390;
  unsigned_long_long local_388;
  QNumber64 local_380;
  unsigned_long_long local_378;
  QNumber64 local_370;
  unsigned_long_long local_368;
  QNumber64 local_360;
  unsigned_long_long local_358;
  QNumber64 local_350;
  int local_344;
  QNumber64 local_340;
  unsigned_long_long local_338;
  QNumber64 local_330;
  unsigned_long_long local_328;
  QNumber64 local_320;
  int local_314;
  QNumber64 local_310;
  unsigned_long_long local_308;
  QNumber64 local_300;
  unsigned_long_long local_2f8;
  QNumber64 local_2f0;
  int local_2e4;
  QNumber64 local_2e0;
  unsigned_long_long local_2d8;
  QNumber64 local_2d0;
  unsigned_long_long local_2c8;
  QNumber64 local_2c0;
  unsigned_long_long local_2b8;
  QNumber64 local_2b0;
  int local_2a4;
  QNumber64 local_2a0;
  unsigned_long_long local_298;
  QNumber64 local_290;
  unsigned_long_long local_288;
  QNumber64 local_280;
  unsigned_long_long local_278;
  QNumber64 local_270;
  unsigned_long_long local_268;
  QNumber64 local_260;
  int local_254;
  QNumber64 local_250;
  unsigned_long_long local_248;
  QNumber64 local_240;
  int local_234;
  QNumber64 local_230;
  unsigned_long_long local_228;
  QNumber64 local_220;
  unsigned_long_long local_218;
  QNumber64 local_210;
  unsigned_long_long local_208;
  QNumber64 local_200;
  unsigned_long_long local_1f8;
  QNumber64 local_1f0;
  unsigned_long_long local_1e8;
  QNumber64 local_1e0;
  unsigned_long_long local_1d8;
  QNumber64 local_1d0;
  unsigned_long_long local_1c8;
  QNumber64 local_1c0;
  int local_1b4;
  QNumber64 local_1b0;
  int local_1a4;
  QNumber64 local_1a0;
  unsigned_long_long local_198;
  QNumber64 local_190;
  int local_184;
  QNumber64 local_180;
  unsigned_long_long local_178;
  QNumber64 local_170;
  int local_164;
  QNumber64 local_160;
  int local_154;
  QNumber64 local_150;
  int local_144;
  QNumber64 local_140;
  int local_134;
  QNumber64 local_130;
  unsigned_long_long local_128;
  QNumber64 local_120;
  int local_114;
  QNumber64 local_110;
  unsigned_long_long local_108;
  QNumber64 local_100;
  unsigned_long_long local_f8;
  QNumber64 local_f0;
  unsigned_long_long local_e8;
  QNumber64 local_e0;
  unsigned_long_long local_d8;
  QNumber64 local_d0;
  unsigned_long_long local_c8;
  QNumber64 local_c0;
  unsigned_long_long local_b8;
  QNumber64 local_b0;
  unsigned_long_long local_a8;
  QNumber64 local_a0;
  unsigned_long_long local_98;
  QNumber64 local_90;
  unsigned_long_long local_88;
  QNumber64 local_80;
  unsigned_long_long local_78;
  QNumber64 local_70;
  unsigned_long_long local_68;
  QNumber64 local_60;
  unsigned_long_long local_58;
  QNumber64 local_50;
  unsigned_long_long local_48;
  QNumber64 local_40;
  char *local_38;
  char *content;
  QNumber64 number;
  Value<char> value;
  QTest *test_local;
  
  value._16_8_ = test;
  Value<char>::Value((Value<char> *)&number);
  QNumber64::QNumber64<int>((QNumber64 *)&content,-1);
  Value<char>::operator+=((Value<char> *)&number,2);
  Value<char>::operator+=((Value<char> *)&number,3);
  Value<char>::operator+=((Value<char> *)&number,-2);
  Value<char>::operator+=((Value<char> *)&number,-3);
  Value<char>::operator+=((Value<char> *)&number,4.0);
  Value<char>::operator+=((Value<char> *)&number,-4.0);
  local_38 = "{var:0}%{var:0}";
  local_40 = TestEvaluate("{var:0}%{var:0}",(Value<char> *)&number);
  local_48 = 0;
  content = (char *)local_40;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_48,0x10df);
  local_38 = "{var:0}%{var:1}";
  local_50 = TestEvaluate("{var:0}%{var:1}",(Value<char> *)&number);
  local_58 = 2;
  content = (char *)local_50;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_58,0x10e3);
  local_38 = "{var:0}%{var:2}";
  local_60 = TestEvaluate("{var:0}%{var:2}",(Value<char> *)&number);
  local_68 = 0;
  content = (char *)local_60;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_68,0x10e7);
  local_38 = "{var:0}%{var:3}";
  local_70 = TestEvaluate("{var:0}%{var:3}",(Value<char> *)&number);
  local_78 = 2;
  content = (char *)local_70;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_78,0x10eb);
  local_38 = "{var:0}%{var:4}";
  local_80 = TestEvaluate("{var:0}%{var:4}",(Value<char> *)&number);
  local_88 = 2;
  content = (char *)local_80;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_88,0x10ef);
  local_38 = "{var:0}%{var:5}";
  local_90 = TestEvaluate("{var:0}%{var:5}",(Value<char> *)&number);
  local_98 = 2;
  content = (char *)local_90;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_98,0x10f3);
  local_38 = "{var:1}%{var:0}";
  local_a0 = TestEvaluate("{var:1}%{var:0}",(Value<char> *)&number);
  local_a8 = 1;
  content = (char *)local_a0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_a8,0x10f9);
  local_38 = "{var:1}%{var:1}";
  local_b0 = TestEvaluate("{var:1}%{var:1}",(Value<char> *)&number);
  local_b8 = 0;
  content = (char *)local_b0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_b8,0x10fd);
  local_38 = "{var:1}%{var:2}";
  local_c0 = TestEvaluate("{var:1}%{var:2}",(Value<char> *)&number);
  local_c8 = 1;
  content = (char *)local_c0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_c8,0x1101);
  local_38 = "{var:1}%{var:3}";
  local_d0 = TestEvaluate("{var:1}%{var:3}",(Value<char> *)&number);
  local_d8 = 0;
  content = (char *)local_d0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_d8,0x1105);
  local_38 = "{var:1}%{var:4}";
  local_e0 = TestEvaluate("{var:1}%{var:4}",(Value<char> *)&number);
  local_e8 = 3;
  content = (char *)local_e0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_e8,0x1109);
  local_38 = "{var:1}%{var:5}";
  local_f0 = TestEvaluate("{var:1}%{var:5}",(Value<char> *)&number);
  local_f8 = 3;
  content = (char *)local_f0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_f8,0x110d);
  local_38 = "{var:2}%{var:0}";
  local_100 = TestEvaluate("{var:2}%{var:0}",(Value<char> *)&number);
  local_108 = 0;
  content = (char *)local_100;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_108,0x1113);
  local_38 = "{var:2}%{var:1}";
  local_110 = TestEvaluate("{var:2}%{var:1}",(Value<char> *)&number);
  local_114 = -2;
  content = (char *)local_110;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_114,0x1117);
  local_38 = "{var:2}%{var:2}";
  local_120 = TestEvaluate("{var:2}%{var:2}",(Value<char> *)&number);
  local_128 = 0;
  content = (char *)local_120;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_128,0x111b);
  local_38 = "{var:2}%{var:3}";
  local_130 = TestEvaluate("{var:2}%{var:3}",(Value<char> *)&number);
  local_134 = -2;
  content = (char *)local_130;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_134,0x111f);
  local_38 = "{var:2}%{var:4}";
  local_140 = TestEvaluate("{var:2}%{var:4}",(Value<char> *)&number);
  local_144 = -2;
  content = (char *)local_140;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_144,0x1123);
  local_38 = "{var:2}%{var:5}";
  local_150 = TestEvaluate("{var:2}%{var:5}",(Value<char> *)&number);
  local_154 = -2;
  content = (char *)local_150;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_154,0x1127);
  local_38 = "{var:3}%{var:0}";
  local_160 = TestEvaluate("{var:3}%{var:0}",(Value<char> *)&number);
  local_164 = -1;
  content = (char *)local_160;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_164,0x112d);
  local_38 = "{var:3}%{var:1}";
  local_170 = TestEvaluate("{var:3}%{var:1}",(Value<char> *)&number);
  local_178 = 0;
  content = (char *)local_170;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_178,0x1131);
  local_38 = "{var:3}%{var:2}";
  local_180 = TestEvaluate("{var:3}%{var:2}",(Value<char> *)&number);
  local_184 = -1;
  content = (char *)local_180;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_184,0x1135);
  local_38 = "{var:3}%{var:3}";
  local_190 = TestEvaluate("{var:3}%{var:3}",(Value<char> *)&number);
  local_198 = 0;
  content = (char *)local_190;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_198,0x1139);
  local_38 = "{var:3}%{var:4}";
  local_1a0 = TestEvaluate("{var:3}%{var:4}",(Value<char> *)&number);
  local_1a4 = -3;
  content = (char *)local_1a0;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_1a4,0x113d);
  local_38 = "{var:3}%{var:5}";
  local_1b0 = TestEvaluate("{var:3}%{var:5}",(Value<char> *)&number);
  local_1b4 = -3;
  content = (char *)local_1b0;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_1b4,0x1141);
  local_38 = "{var:4}%{var:0}";
  local_1c0 = TestEvaluate("{var:4}%{var:0}",(Value<char> *)&number);
  local_1c8 = 0;
  content = (char *)local_1c0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1c8,0x1147);
  local_38 = "{var:4}%{var:1}";
  local_1d0 = TestEvaluate("{var:4}%{var:1}",(Value<char> *)&number);
  local_1d8 = 1;
  content = (char *)local_1d0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1d8,0x114b);
  local_38 = "{var:4}%{var:2}";
  local_1e0 = TestEvaluate("{var:4}%{var:2}",(Value<char> *)&number);
  local_1e8 = 0;
  content = (char *)local_1e0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1e8,0x114f);
  local_38 = "{var:4}%{var:3}";
  local_1f0 = TestEvaluate("{var:4}%{var:3}",(Value<char> *)&number);
  local_1f8 = 1;
  content = (char *)local_1f0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_1f8,0x1153);
  local_38 = "{var:4}%{var:4}";
  local_200 = TestEvaluate("{var:4}%{var:4}",(Value<char> *)&number);
  local_208 = 0;
  content = (char *)local_200;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_208,0x1157);
  local_38 = "{var:4}%{var:5}";
  local_210 = TestEvaluate("{var:4}%{var:5}",(Value<char> *)&number);
  local_218 = 0;
  content = (char *)local_210;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_218,0x115b);
  local_38 = "{var:5}%{var:0}";
  local_220 = TestEvaluate("{var:5}%{var:0}",(Value<char> *)&number);
  local_228 = 0;
  content = (char *)local_220;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_228,0x1161);
  local_38 = "{var:5}%{var:1}";
  local_230 = TestEvaluate("{var:5}%{var:1}",(Value<char> *)&number);
  local_234 = -1;
  content = (char *)local_230;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_234,0x1165);
  local_38 = "{var:5}%{var:2}";
  local_240 = TestEvaluate("{var:5}%{var:2}",(Value<char> *)&number);
  local_248 = 0;
  content = (char *)local_240;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_248,0x1169);
  local_38 = "{var:5}%{var:3}";
  local_250 = TestEvaluate("{var:5}%{var:3}",(Value<char> *)&number);
  local_254 = -1;
  content = (char *)local_250;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_254,0x116d);
  local_38 = "{var:5}%{var:4}";
  local_260 = TestEvaluate("{var:5}%{var:4}",(Value<char> *)&number);
  local_268 = 0;
  content = (char *)local_260;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_268,0x1171);
  local_38 = "{var:5}%{var:5}";
  local_270 = TestEvaluate("{var:5}%{var:5}",(Value<char> *)&number);
  local_278 = 0;
  content = (char *)local_270;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_278,0x1175);
  local_38 = "{var:1}%{var:0}";
  local_280 = TestEvaluate("{var:1}%{var:0}",(Value<char> *)&number);
  local_288 = 1;
  content = (char *)local_280;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_288,0x117b);
  local_38 = "{var:2}%{var:0}";
  local_290 = TestEvaluate("{var:2}%{var:0}",(Value<char> *)&number);
  local_298 = 0;
  content = (char *)local_290;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_298,0x117f);
  local_38 = "{var:3}%{var:0}";
  local_2a0 = TestEvaluate("{var:3}%{var:0}",(Value<char> *)&number);
  local_2a4 = -1;
  content = (char *)local_2a0;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_2a4,0x1183);
  local_38 = "{var:4}%{var:0}";
  local_2b0 = TestEvaluate("{var:4}%{var:0}",(Value<char> *)&number);
  local_2b8 = 0;
  content = (char *)local_2b0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2b8,0x1187);
  local_38 = "{var:5}%{var:0}";
  local_2c0 = TestEvaluate("{var:5}%{var:0}",(Value<char> *)&number);
  local_2c8 = 0;
  content = (char *)local_2c0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2c8,0x118b);
  local_38 = "{var:0}%{var:1}";
  local_2d0 = TestEvaluate("{var:0}%{var:1}",(Value<char> *)&number);
  local_2d8 = 2;
  content = (char *)local_2d0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2d8,0x1191);
  local_38 = "{var:2}%{var:1}";
  local_2e0 = TestEvaluate("{var:2}%{var:1}",(Value<char> *)&number);
  local_2e4 = -2;
  content = (char *)local_2e0;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_2e4,0x1195);
  local_38 = "{var:3}%{var:1}";
  local_2f0 = TestEvaluate("{var:3}%{var:1}",(Value<char> *)&number);
  local_2f8 = 0;
  content = (char *)local_2f0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_2f8,0x1199);
  local_38 = "{var:4}%{var:1}";
  local_300 = TestEvaluate("{var:4}%{var:1}",(Value<char> *)&number);
  local_308 = 1;
  content = (char *)local_300;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_308,0x119d);
  local_38 = "{var:5}%{var:1}";
  local_310 = TestEvaluate("{var:5}%{var:1}",(Value<char> *)&number);
  local_314 = -1;
  content = (char *)local_310;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_314,0x11a1);
  local_38 = "{var:0}%{var:2}";
  local_320 = TestEvaluate("{var:0}%{var:2}",(Value<char> *)&number);
  local_328 = 0;
  content = (char *)local_320;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_328,0x11a7);
  local_38 = "{var:1}%{var:2}";
  local_330 = TestEvaluate("{var:1}%{var:2}",(Value<char> *)&number);
  local_338 = 1;
  content = (char *)local_330;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_338,0x11ab);
  local_38 = "{var:3}%{var:2}";
  local_340 = TestEvaluate("{var:3}%{var:2}",(Value<char> *)&number);
  local_344 = -1;
  content = (char *)local_340;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_344,0x11af);
  local_38 = "{var:4}%{var:2}";
  local_350 = TestEvaluate("{var:4}%{var:2}",(Value<char> *)&number);
  local_358 = 0;
  content = (char *)local_350;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_358,0x11b3);
  local_38 = "{var:5}%{var:2}";
  local_360 = TestEvaluate("{var:5}%{var:2}",(Value<char> *)&number);
  local_368 = 0;
  content = (char *)local_360;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_368,0x11b7);
  local_38 = "{var:0}%{var:3}";
  local_370 = TestEvaluate("{var:0}%{var:3}",(Value<char> *)&number);
  local_378 = 2;
  content = (char *)local_370;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_378,0x11bd);
  local_38 = "{var:1}%{var:3}";
  local_380 = TestEvaluate("{var:1}%{var:3}",(Value<char> *)&number);
  local_388 = 0;
  content = (char *)local_380;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_388,0x11c1);
  local_38 = "{var:2}%{var:3}";
  local_390 = TestEvaluate("{var:2}%{var:3}",(Value<char> *)&number);
  local_394 = -2;
  content = (char *)local_390;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_394,0x11c5);
  local_38 = "{var:4}%{var:3}";
  local_3a0 = TestEvaluate("{var:4}%{var:3}",(Value<char> *)&number);
  local_3a8 = 1;
  content = (char *)local_3a0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3a8,0x11c9);
  local_38 = "{var:5}%{var:3}";
  local_3b0 = TestEvaluate("{var:5}%{var:3}",(Value<char> *)&number);
  local_3b4 = -1;
  content = (char *)local_3b0;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_3b4,0x11cd);
  local_38 = "{var:0}%{var:4}";
  local_3c0 = TestEvaluate("{var:0}%{var:4}",(Value<char> *)&number);
  local_3c8 = 2;
  content = (char *)local_3c0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3c8,0x11d3);
  local_38 = "{var:1}%{var:4}";
  local_3d0 = TestEvaluate("{var:1}%{var:4}",(Value<char> *)&number);
  local_3d8 = 3;
  content = (char *)local_3d0;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_3d8,0x11d7);
  local_38 = "{var:2}%{var:4}";
  local_3e0 = TestEvaluate("{var:2}%{var:4}",(Value<char> *)&number);
  local_3e4 = -2;
  content = (char *)local_3e0;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_3e4,0x11db);
  local_38 = "{var:3}%{var:4}";
  local_3f0 = TestEvaluate("{var:3}%{var:4}",(Value<char> *)&number);
  local_3f4 = -3;
  content = (char *)local_3f0;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_3f4,0x11df);
  local_38 = "{var:5}%{var:4}";
  local_400 = TestEvaluate("{var:5}%{var:4}",(Value<char> *)&number);
  local_408 = 0;
  content = (char *)local_400;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_408,0x11e3);
  local_38 = "{var:0}%{var:5}";
  local_410 = TestEvaluate("{var:0}%{var:5}",(Value<char> *)&number);
  local_418 = 2;
  content = (char *)local_410;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_418,0x11e9);
  local_38 = "{var:1}%{var:5}";
  local_420 = TestEvaluate("{var:1}%{var:5}",(Value<char> *)&number);
  local_428 = 3;
  content = (char *)local_420;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_428,0x11ed);
  local_38 = "{var:2}%{var:5}";
  local_430 = TestEvaluate("{var:2}%{var:5}",(Value<char> *)&number);
  local_434 = -2;
  content = (char *)local_430;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_434,0x11f1);
  local_38 = "{var:3}%{var:5}";
  local_440 = TestEvaluate("{var:3}%{var:5}",(Value<char> *)&number);
  local_444 = -3;
  content = (char *)local_440;
  QTest::IsEqual<long_long,int>((QTest *)value._16_8_,(longlong *)&content,&local_444,0x11f5);
  local_38 = "{var:4}%{var:5}";
  local_450 = TestEvaluate("{var:4}%{var:5}",(Value<char> *)&number);
  local_458 = 0;
  content = (char *)local_450;
  QTest::IsEqual<unsigned_long_long,unsigned_long_long>
            ((QTest *)value._16_8_,(unsigned_long_long *)&content,&local_458,0x11f9);
  Value<char>::~Value((Value<char> *)&number);
  return;
}

Assistant:

static void TestEvaluate18(QTest &test) {
    Value<char> value;
    QNumber64   number{-1};
    const char *content;

    value += 2U;
    value += 3U;
    value += -2;
    value += -3;
    value += 4.0F;
    value += -4.0F;

    content = "{var:0}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:0}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:0}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:0}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    //////////////////

    content = "{var:1}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:1}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:1}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:1}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    //////////////////

    content = "{var:2}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:2}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    //////////////////

    content = "{var:3}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:3}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:3}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:3}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    //////////

    content = "{var:4}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:4}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:4}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////

    content = "{var:5}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:5}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:5}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    ////////////////////////////////////////

    content = "{var:1}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:2}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:3}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:4}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:0}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////////////

    content = "{var:0}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:2}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:4}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:5}%{var:1}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    //////////////////

    content = "{var:0}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:1}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:3}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    content = "{var:4}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:5}%{var:2}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////////////

    content = "{var:0}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    content = "{var:2}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:4}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 1ULL, __LINE__);

    content = "{var:5}%{var:3}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -1, __LINE__);

    //////////

    content = "{var:0}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:2}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:5}%{var:4}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);

    //////////

    content = "{var:0}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 2ULL, __LINE__);

    content = "{var:1}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 3ULL, __LINE__);

    content = "{var:2}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -2, __LINE__);

    content = "{var:3}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Integer, -3, __LINE__);

    content = "{var:4}%{var:5}";
    number  = TestEvaluate(content, value);
    test.IsEqual(number.Natural, 0ULL, __LINE__);
}